

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

void FT_Done_GlyphSlot(FT_GlyphSlot slot)

{
  FT_Memory pFVar1;
  FT_GlyphSlot pFVar2;
  FT_Generic_Finalizer p_Var3;
  FT_GlyphSlot_conflict *ppFVar4;
  FT_GlyphSlot pFVar5;
  FT_GlyphSlot *ppFVar6;
  
  if (slot != (FT_GlyphSlot)0x0) {
    pFVar1 = (slot->face->driver->root).memory;
    ppFVar4 = &slot->face->glyph;
    pFVar5 = (FT_GlyphSlot)0x0;
    ppFVar6 = ppFVar4;
    while (pFVar2 = *ppFVar6, pFVar2 != (FT_GlyphSlot)0x0) {
      if (pFVar2 == slot) {
        ppFVar6 = &pFVar5->next;
        if (pFVar5 == (FT_GlyphSlot)0x0) {
          ppFVar6 = ppFVar4;
        }
        *ppFVar6 = pFVar2->next;
        p_Var3 = (slot->generic).finalizer;
        if (p_Var3 != (FT_Generic_Finalizer)0x0) {
          (*p_Var3)(slot);
        }
        ft_glyphslot_done(slot);
        (*pFVar1->free)(pFVar1,slot);
        return;
      }
      pFVar5 = pFVar2;
      ppFVar6 = &pFVar2->next;
    }
  }
  return;
}

Assistant:

FT_BASE_DEF( void )
  FT_Done_GlyphSlot( FT_GlyphSlot  slot )
  {
    if ( slot )
    {
      FT_Driver     driver = slot->face->driver;
      FT_Memory     memory = driver->root.memory;
      FT_GlyphSlot  prev;
      FT_GlyphSlot  cur;


      /* Remove slot from its parent face's list */
      prev = NULL;
      cur  = slot->face->glyph;

      while ( cur )
      {
        if ( cur == slot )
        {
          if ( !prev )
            slot->face->glyph = cur->next;
          else
            prev->next = cur->next;

          /* finalize client-specific data */
          if ( slot->generic.finalizer )
            slot->generic.finalizer( slot );

          ft_glyphslot_done( slot );
          FT_FREE( slot );
          break;
        }
        prev = cur;
        cur  = cur->next;
      }
    }
  }